

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

string * base64_encode_abi_cxx11_(string *__return_storage_ptr__,uchar *bytes_to_encode,uint in_len)

{
  ulong uVar1;
  byte bVar2;
  ulong in_RAX;
  char cVar3;
  uint uVar4;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uStack_38;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (in_len != 0) {
    uVar9 = 0;
    uStack_38 = in_RAX;
    do {
      uVar1 = uStack_38;
      uVar4 = (int)uVar9 + 1;
      uVar5 = (ulong)uVar4;
      *(uchar *)((long)&uStack_38 + uVar9 + 5) = *bytes_to_encode;
      cVar3 = (char)__return_storage_ptr__;
      if (uVar4 == 3) {
        uStack_38._0_2_ = CONCAT11(uStack_38._5_1_ >> 2,(undefined1)uStack_38);
        uStack_38._0_3_ =
             CONCAT12((uStack_38._5_1_ & 3) << 4 | uStack_38._6_1_ >> 4,(undefined2)uStack_38);
        uStack_38._7_1_ = SUB81(uVar1,7);
        bVar2 = uStack_38._7_1_;
        uStack_38._0_4_ =
             CONCAT13((uStack_38._6_1_ & 0xf) << 2 | uStack_38._7_1_ >> 6,(undefined3)uStack_38);
        uStack_38._5_3_ = SUB83(uVar1,5);
        uStack_38 = CONCAT35(uStack_38._5_3_,CONCAT14(bVar2,(undefined4)uStack_38)) &
                    0xffffff3fffffffff;
        lVar6 = 0;
        do {
          std::__cxx11::string::push_back(cVar3);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        uVar5 = 0;
      }
      in_len = in_len - 1;
      bytes_to_encode = bytes_to_encode + 1;
      uVar9 = uVar5;
    } while (in_len != 0);
    iVar8 = (int)uVar5;
    if (iVar8 != 0) {
      if (iVar8 < 3) {
        memset((void *)((long)&uStack_38 + uVar5 + 5),0,(ulong)(2 - iVar8) + 1);
      }
      uVar9 = uStack_38;
      uStack_38._0_2_ = CONCAT11(uStack_38._5_1_ >> 2,(undefined1)uStack_38);
      uStack_38._0_3_ =
           CONCAT12((uStack_38._5_1_ & 3) << 4 | uStack_38._6_1_ >> 4,(undefined2)uStack_38);
      uStack_38._7_1_ = SUB81(uVar9,7);
      bVar2 = uStack_38._7_1_;
      uStack_38._0_4_ =
           CONCAT13((uStack_38._6_1_ & 0xf) << 2 | uStack_38._7_1_ >> 6,(undefined3)uStack_38);
      uStack_38._5_3_ = SUB83(uVar9,5);
      uStack_38 = CONCAT35(uStack_38._5_3_,CONCAT14(bVar2,(undefined4)uStack_38)) &
                  0xffffff3fffffffff;
      if (-1 < iVar8) {
        uVar9 = 0;
        do {
          std::__cxx11::string::push_back(cVar3);
          uVar9 = uVar9 + 1;
        } while (iVar8 + 1 != uVar9);
      }
      iVar7 = 3;
      if (3 < iVar8) {
        iVar7 = iVar8;
      }
      iVar8 = (iVar7 - iVar8) + 1;
      while (iVar8 = iVar8 + -1, iVar8 != 0) {
        std::__cxx11::string::push_back(cVar3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(unsigned char const* bytes_to_encode,
                          unsigned int in_len)
{
    std::string ret;
    int i = 0;
    int j = 0;
    unsigned char char_array_3[3];
    unsigned char char_array_4[4];

    while (in_len--) {
        char_array_3[i++] = *(bytes_to_encode++);
        if (i == 3) {
            char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
            char_array_4[1] = ((char_array_3[0] & 0x03) << 4) +
                              ((char_array_3[1] & 0xf0) >> 4);
            char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) +
                              ((char_array_3[2] & 0xc0) >> 6);
            char_array_4[3] = char_array_3[2] & 0x3f;

            for (i = 0; (i < 4); i++)
                ret += base64_chars[char_array_4[i]];
            i = 0;
        }
    }

    if (i) {
        for (j = i; j < 3; j++)
            char_array_3[j] = '\0';

        char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
        char_array_4[1] =
            ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
        char_array_4[2] =
            ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
        char_array_4[3] = char_array_3[2] & 0x3f;

        for (j = 0; (j < i + 1); j++)
            ret += base64_chars[char_array_4[j]];

        while ((i++ < 3))
            ret += '=';
    }

    return ret;
}